

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O2

int gmlc::utilities::string_viewOps::toIntSimple(string_view input)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0;
  for (sVar2 = 0; input._M_len != sVar2; sVar2 = sVar2 + 1) {
    if ((byte)(input._M_str[sVar2] - 0x30U) < 10) {
      iVar1 = iVar1 * 10 + -0x30 + (uint)(byte)input._M_str[sVar2];
    }
  }
  return iVar1;
}

Assistant:

int toIntSimple(std::string_view input)
{
    int ret = 0;
    for (auto testChar : input) {
        if (testChar >= '0' && testChar <= '9') {
            ret = 10 * ret + (testChar - '0');
        }
    }
    return ret;
}